

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::ascii::anon_unknown_3::ParseDouble
          (expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,anon_unknown_3 *this,string *s)

{
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar1;
  expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  from_chars_result_t<char> fVar2;
  double result;
  value_type_conflict5 local_18;
  unexpected_type<const_char_*> local_10;
  
  fVar2 = fast_float::from_chars_advanced<double,char>
                    ((char *)this,(char *)(this + (long)s),&local_18,
                     (parse_options_t<char>)0x2e00000005);
  peVar1 = (expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)fVar2.ptr;
  if (fVar2.ec == 0) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = local_18;
  }
  else {
    local_10.m_error = "Parse failed.";
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_10);
    peVar1 = extraout_RAX;
  }
  return peVar1;
}

Assistant:

nonstd::expected<double, std::string> ParseDouble(const std::string &s) {

  // Parse with fast_float
  double result;
  auto ans = fast_float::from_chars(s.data(), s.data() + s.size(), result);
  if (ans.ec != std::errc()) {
    // Current `fast_float` implementation does not report detailed parsing err.
    return nonstd::make_unexpected("Parse failed.");
  }

  return result;
}